

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

bool absl::operator<(uint128 lhs,uint128 rhs)

{
  unsigned___int128 *puVar1;
  unsigned___int128 *puVar2;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  uint128 *this;
  uint64_t local_28;
  uint128 rhs_local;
  uint128 lhs_local;
  
  this = (uint128 *)lhs.hi_;
  rhs_local.hi_ = lhs.lo_;
  rhs_local.lo_ = rhs.hi_;
  local_28 = rhs.lo_;
  puVar1 = uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)&rhs_local.hi_,this);
  puVar2 = uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)&local_28,this);
  return extraout_RDX < extraout_RDX_00 || extraout_RDX - extraout_RDX_00 < (ulong)(puVar1 < puVar2)
  ;
}

Assistant:

constexpr bool operator<(uint128 lhs, uint128 rhs) {
#ifdef ABSL_HAVE_INTRINSIC_INT128
  return static_cast<unsigned __int128>(lhs) <
         static_cast<unsigned __int128>(rhs);
#else
  return (Uint128High64(lhs) == Uint128High64(rhs))
             ? (Uint128Low64(lhs) < Uint128Low64(rhs))
             : (Uint128High64(lhs) < Uint128High64(rhs));
#endif
}